

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O2

int imagetopng(opj_image_t *image,char *write_idf)

{
  opj_image_comp_t *poVar1;
  png_byte pVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  OPJ_INT32 OVar6;
  FILE *__stream;
  png_structp ppVar7;
  png_infop ppVar8;
  __jmp_buf_tag *__env;
  size_t __size;
  opj_image_comp_t *poVar9;
  ulong uVar10;
  OPJ_SIZE_T OVar11;
  uint uVar12;
  long lVar13;
  char *__ptr;
  long lVar14;
  code *pcVar15;
  ulong uVar16;
  size_t sStack_e0;
  int prec;
  png_color_8 sig_bit;
  int fails;
  OPJ_INT32 *buffer32s;
  png_bytep row_buf;
  FILE *writer;
  png_infop info;
  png_structp png;
  convert_32s_PXCX local_70;
  png_infop local_68;
  char *local_60;
  OPJ_INT32 *planes [4];
  
  png = (png_structp)0x0;
  info = (png_infop)0x0;
  row_buf = (png_bytep)0x0;
  buffer32s = (OPJ_INT32 *)0x0;
  fails = 1;
  sig_bit.red = '\0';
  sig_bit.green = '\0';
  sig_bit.blue = '\0';
  sig_bit.gray = '\0';
  sig_bit.alpha = '\0';
  poVar9 = image->comps;
  prec = poVar9->prec;
  planes[0] = poVar9->data;
  uVar5 = image->numcomps;
  uVar3 = 4;
  if ((int)uVar5 < 4) {
    uVar3 = uVar5;
  }
  uVar16 = (ulong)(int)uVar3;
  uVar12 = fails;
  if (1 < (int)uVar3) {
    uVar12 = uVar3;
  }
  poVar1 = poVar9;
  for (lVar13 = 1; lVar13 < (long)uVar16; lVar13 = lVar13 + 1) {
    if ((((poVar9->dx != poVar1[1].dx) || (poVar9->dy != poVar1[1].dy)) || (prec != poVar1[1].prec))
       || (poVar9->sgnd != poVar1[1].sgnd)) {
      uVar12 = (uint)lVar13;
      break;
    }
    planes[lVar13] = poVar1[1].data;
    poVar1 = poVar1 + 1;
  }
  if (uVar12 != uVar3) {
    fwrite("imagetopng: All components shall have the same subsampling, same bit depth, same sign.\n"
           ,0x57,1,_stderr);
    fwrite("\tAborting\n",10,1,_stderr);
    return 1;
  }
  lVar13 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  lVar14 = (ulong)uVar3 << 6;
  for (; lVar14 != lVar13; lVar13 = lVar13 + 0x40) {
    clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar13),image->comps->prec);
  }
  if ((prec < 9) || (0xf < prec)) {
    if (((int)uVar5 < 2) || (7 < prec)) {
      if (((1 < prec) && (prec < 8)) && ((prec == 6 || ((prec & 1U) != 0)))) {
        if ((prec == 5) || (prec == 6)) {
          prec = 8;
        }
        else {
          prec = prec + 1;
        }
        for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 0x40) {
          scale_component((opj_image_comp_t *)((long)&image->comps->dx + lVar13),prec);
        }
      }
    }
    else {
      for (lVar13 = 0; uVar16 << 6 != lVar13; lVar13 = lVar13 + 0x40) {
        scale_component((opj_image_comp_t *)((long)&image->comps->dx + lVar13),8);
      }
      prec = 8;
    }
  }
  else {
    for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 0x40) {
      scale_component((opj_image_comp_t *)((long)&image->comps->dx + lVar13),0x10);
    }
    prec = 0x10;
  }
  if ((((prec != 1) && (prec != 2)) && (prec != 4)) && ((prec != 8 && (prec != 0x10)))) {
    fprintf(_stderr,"imagetopng: can not create %s\n\twrong bit_depth %d\n",write_idf,
            (ulong)(uint)prec);
    return 1;
  }
  __stream = fopen(write_idf,"wb");
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  ppVar7 = (png_structp)png_create_write_struct("1.6.37",0,0);
  png = ppVar7;
  if (ppVar7 == (png_structp)0x0) goto LAB_001101ee;
  ppVar8 = (png_infop)png_create_info_struct(ppVar7);
  info = ppVar8;
  if (ppVar8 != (png_infop)0x0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar7,longjmp,200);
    iVar4 = _setjmp(__env);
    if (iVar4 == 0) {
      png_init_io(ppVar7,__stream);
      png_set_compression_level(ppVar7,9);
      pVar2 = (png_byte)prec;
      if ((int)uVar5 < 3) {
        sig_bit.gray = pVar2;
        uVar5 = 0;
      }
      else {
        sig_bit.blue = pVar2;
        sig_bit.green = pVar2;
        sig_bit.red = pVar2;
        uVar5 = 2;
      }
      if ((uVar16 & 1) == 0) {
        uVar5 = uVar5 | 4;
        sig_bit.alpha = pVar2;
      }
      png_set_IHDR(ppVar7,ppVar8,image->comps->w,image->comps->h,prec,uVar5,0,0,0);
      png_set_sBIT(ppVar7,ppVar8,&sig_bit);
      png_write_info(ppVar7,ppVar8);
      __size = png_get_rowbytes(ppVar7,ppVar8);
      poVar9 = image->comps;
      uVar10 = (ulong)poVar9->w;
      OVar11 = uVar10 * uVar16;
      if ((long)prec * OVar11 + 7 >> 3 == __size) {
        row_buf = (png_bytep)malloc(__size);
        if (row_buf == (OPJ_BYTE *)0x0) {
          __ptr = "Can\'t allocate memory for PNG row\n";
          sStack_e0 = 0x22;
        }
        else {
          buffer32s = (OPJ_INT32 *)malloc(OVar11 * 4);
          if (buffer32s != (OPJ_INT32 *)0x0) {
            local_70 = convert_32s_PXCX_LUT[uVar16];
            if (poVar9->sgnd == 0) {
              OVar6 = 0;
            }
            else {
              OVar6 = 1 << (pVar2 - 1 & 0x1f);
            }
            uVar5 = 0;
            pcVar15 = (convert_32sXXx_C1R)0x0;
            local_68 = ppVar8;
            local_60 = write_idf;
            if ((uint)prec < 0x11) {
              if ((0x116U >> (prec & 0x1fU) & 1) == 0) {
                if (prec == 0x10) {
                  pcVar15 = convert_32s16u_C1R;
                }
              }
              else {
                pcVar15 = convert_32sXXu_C1R_LUT[prec];
              }
            }
            for (; uVar5 < poVar9->h; uVar5 = uVar5 + 1) {
              (*local_70)(planes,buffer32s,uVar10,OVar6);
              (*pcVar15)(buffer32s,row_buf,OVar11);
              png_write_row(ppVar7,row_buf);
              planes[0] = planes[0] + uVar10;
              planes[1] = planes[1] + uVar10;
              planes[2] = planes[2] + uVar10;
              planes[3] = planes[3] + uVar10;
              poVar9 = image->comps;
            }
            png_write_end(ppVar7,local_68);
            fails = 0;
            write_idf = local_60;
            goto LAB_001101df;
          }
          __ptr = "Can\'t allocate memory for interleaved 32s row\n";
          sStack_e0 = 0x2e;
        }
      }
      else {
        __ptr = "Invalid PNG row size\n";
        sStack_e0 = 0x15;
      }
      fwrite(__ptr,sStack_e0,1,_stderr);
    }
  }
LAB_001101df:
  png_destroy_write_struct(&png,&info);
LAB_001101ee:
  if (row_buf != (png_bytep)0x0) {
    free(row_buf);
  }
  if (buffer32s != (OPJ_INT32 *)0x0) {
    free(buffer32s);
  }
  fclose(__stream);
  if (fails != 0) {
    remove(write_idf);
  }
  return fails;
}

Assistant:

int imagetopng(opj_image_t * image, const char *write_idf)
{
    FILE * volatile writer = NULL;
    png_structp png = NULL;
    png_infop info = NULL;
    png_bytep volatile row_buf = NULL;
    int nr_comp, color_type;
    volatile int prec;
    png_color_8 sig_bit;
    OPJ_INT32 const* planes[4];
    int i;
    OPJ_INT32* volatile buffer32s = NULL;

    volatile int fails = 1;

    memset(&sig_bit, 0, sizeof(sig_bit));
    prec = (int)image->comps[0].prec;
    planes[0] = image->comps[0].data;
    nr_comp = (int)image->numcomps;

    if (nr_comp > 4) {
        nr_comp = 4;
    }
    for (i = 1; i < nr_comp; ++i) {
        if (image->comps[0].dx != image->comps[i].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[i].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[i].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[i].sgnd) {
            break;
        }
        planes[i] = image->comps[i].data;
    }
    if (i != nr_comp) {
        fprintf(stderr,
                "imagetopng: All components shall have the same subsampling, same bit depth, same sign.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }
    for (i = 0; i < nr_comp; ++i) {
        clip_component(&(image->comps[i]), image->comps[0].prec);
    }
    if (prec > 8 && prec < 16) {
        for (i = 0; i < nr_comp; ++i) {
            scale_component(&(image->comps[i]), 16);
        }
        prec = 16;
    } else if (prec < 8 && nr_comp > 1) { /* GRAY_ALPHA, RGB, RGB_ALPHA */
        for (i = 0; i < nr_comp; ++i) {
            scale_component(&(image->comps[i]), 8);
        }
        prec = 8;
    } else if ((prec > 1) && (prec < 8) && ((prec == 6) ||
                                            ((prec & 1) == 1))) { /* GRAY with non native precision */
        if ((prec == 5) || (prec == 6)) {
            prec = 8;
        } else {
            prec++;
        }
        for (i = 0; i < nr_comp; ++i) {
            scale_component(&(image->comps[i]), (OPJ_UINT32)prec);
        }
    }

    if (prec != 1 && prec != 2 && prec != 4 && prec != 8 && prec != 16) {
        fprintf(stderr, "imagetopng: can not create %s\n\twrong bit_depth %d\n",
                write_idf, prec);
        return fails;
    }

    writer = fopen(write_idf, "wb");

    if (writer == NULL) {
        return fails;
    }

    /* Create and initialize the png_struct with the desired error handler
     * functions.  If you want to use the default stderr and longjump method,
     * you can supply NULL for the last three parameters.  We also check that
     * the library version is compatible with the one used at compile time,
     * in case we are using dynamically linked libraries.  REQUIRED.
     */
    png = png_create_write_struct(PNG_LIBPNG_VER_STRING,
                                  NULL, NULL, NULL);
    /*png_voidp user_error_ptr, user_error_fn, user_warning_fn); */

    if (png == NULL) {
        goto fin;
    }

    /* Allocate/initialize the image information data.  REQUIRED
     */
    info = png_create_info_struct(png);

    if (info == NULL) {
        goto fin;
    }

    /* Set error handling.  REQUIRED if you are not supplying your own
     * error handling functions in the png_create_write_struct() call.
     */
    if (setjmp(png_jmpbuf(png))) {
        goto fin;
    }

    /* I/O initialization functions is REQUIRED
     */
    png_init_io(png, writer);

    /* Set the image information here.  Width and height are up to 2^31,
     * bit_depth is one of 1, 2, 4, 8, or 16, but valid values also depend on
     * the color_type selected. color_type is one of PNG_COLOR_TYPE_GRAY,
     * PNG_COLOR_TYPE_GRAY_ALPHA, PNG_COLOR_TYPE_PALETTE, PNG_COLOR_TYPE_RGB,
     * or PNG_COLOR_TYPE_RGB_ALPHA.  interlace is either PNG_INTERLACE_NONE or
     * PNG_INTERLACE_ADAM7, and the compression_type and filter_type MUST
     * currently be PNG_COMPRESSION_TYPE_BASE and PNG_FILTER_TYPE_BASE.
     * REQUIRED
     *
     * ERRORS:
     *
     * color_type == PNG_COLOR_TYPE_PALETTE && bit_depth > 8
     * color_type == PNG_COLOR_TYPE_RGB && bit_depth < 8
     * color_type == PNG_COLOR_TYPE_GRAY_ALPHA && bit_depth < 8
     * color_type == PNG_COLOR_TYPE_RGB_ALPHA) && bit_depth < 8
     *
     */
    png_set_compression_level(png, Z_BEST_COMPRESSION);

    if (nr_comp >= 3) { /* RGB(A) */
        color_type = PNG_COLOR_TYPE_RGB;
        sig_bit.red = sig_bit.green = sig_bit.blue = (png_byte)prec;
    } else { /* GRAY(A) */
        color_type = PNG_COLOR_TYPE_GRAY;
        sig_bit.gray = (png_byte)prec;
    }
    if ((nr_comp & 1) == 0) { /* ALPHA */
        color_type |= PNG_COLOR_MASK_ALPHA;
        sig_bit.alpha = (png_byte)prec;
    }

    png_set_IHDR(png, info, image->comps[0].w, image->comps[0].h, prec, color_type,
                 PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE,  PNG_FILTER_TYPE_BASE);

    png_set_sBIT(png, info, &sig_bit);
    /* png_set_gamma(png, 2.2, 1./2.2); */
    /* png_set_sRGB(png, info, PNG_sRGB_INTENT_PERCEPTUAL); */
    png_write_info(png, info);

    /* setup conversion */
    {
        OPJ_SIZE_T rowStride;
        png_size_t png_row_size;

        png_row_size = png_get_rowbytes(png, info);
        rowStride = ((OPJ_SIZE_T)image->comps[0].w * (OPJ_SIZE_T)nr_comp *
                     (OPJ_SIZE_T)prec + 7U) / 8U;
        if (rowStride != (OPJ_SIZE_T)png_row_size) {
            fprintf(stderr, "Invalid PNG row size\n");
            goto fin;
        }
        row_buf = (png_bytep)malloc(png_row_size);
        if (row_buf == NULL) {
            fprintf(stderr, "Can't allocate memory for PNG row\n");
            goto fin;
        }
        buffer32s = (OPJ_INT32*)malloc((OPJ_SIZE_T)image->comps[0].w *
                                       (OPJ_SIZE_T)nr_comp * sizeof(OPJ_INT32));
        if (buffer32s == NULL) {
            fprintf(stderr, "Can't allocate memory for interleaved 32s row\n");
            goto fin;
        }
    }

    /* convert */
    {
        OPJ_SIZE_T width = image->comps[0].w;
        OPJ_UINT32 y;
        convert_32s_PXCX cvtPxToCx = convert_32s_PXCX_LUT[nr_comp];
        convert_32sXXx_C1R cvt32sToPack = NULL;
        OPJ_INT32 adjust = image->comps[0].sgnd ? 1 << (prec - 1) : 0;
        png_bytep row_buf_cpy = row_buf;
        OPJ_INT32* buffer32s_cpy = buffer32s;

        switch (prec) {
        case 1:
        case 2:
        case 4:
        case 8:
            cvt32sToPack = convert_32sXXu_C1R_LUT[prec];
            break;
        case 16:
            cvt32sToPack = convert_32s16u_C1R;
            break;
        default:
            /* never here */
            break;
        }

        for (y = 0; y < image->comps[0].h; ++y) {
            cvtPxToCx(planes, buffer32s_cpy, width, adjust);
            cvt32sToPack(buffer32s_cpy, row_buf_cpy, width * (OPJ_SIZE_T)nr_comp);
            png_write_row(png, row_buf_cpy);
            planes[0] += width;
            planes[1] += width;
            planes[2] += width;
            planes[3] += width;
        }
    }

    png_write_end(png, info);

    fails = 0;

fin:
    if (png) {
        png_destroy_write_struct(&png, &info);
    }
    if (row_buf) {
        free(row_buf);
    }
    if (buffer32s) {
        free(buffer32s);
    }
    fclose(writer);

    if (fails) {
        (void)remove(write_idf);    /* ignore return value */
    }

    return fails;
}